

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

bool remove_obj(CHAR_DATA *ch,int iWear,bool fReplace)

{
  OBJ_DATA *obj_00;
  OBJ_DATA *pOVar1;
  byte in_DL;
  int in_ESI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  OBJ_DATA *in_stack_00000008;
  CHAR_DATA *in_stack_00000010;
  OBJ_DATA *revealed;
  OBJ_DATA *secondary;
  OBJ_DATA *obj;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffffd0;
  OBJ_DATA *obj_01;
  undefined1 uVar3;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  obj_00 = get_eq_char(in_RDI,in_ESI);
  if ((in_ESI == 0x15) || (obj_00 == (OBJ_DATA *)0x0)) {
    bVar4 = true;
  }
  else if ((in_DL & 1) == 0) {
    bVar4 = false;
  }
  else {
    ch_00 = (CHAR_DATA *)obj_00->extra_flags[0];
    _Var2 = std::pow<int,int>(0,0x576212);
    if (((ulong)ch_00 & (long)_Var2) != 0) {
      act(in_stack_ffffffffffffffd0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
      bVar4 = is_immortal(in_stack_ffffffffffffffb8);
      if (!bVar4) {
        return false;
      }
    }
    bVar4 = is_affected_obj(obj_00,(int)gsn_rust);
    if (bVar4) {
      act(in_stack_ffffffffffffffd0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
      bVar4 = false;
    }
    else {
      if ((in_ESI == 0x10) && (bVar4 = is_affected(in_RDI,(int)gsn_unbreakable), bVar4)) {
        act(in_stack_ffffffffffffffd0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
        bVar4 = is_immortal(in_stack_ffffffffffffffb8);
        if (!bVar4) {
          return false;
        }
      }
      bVar4 = check_entwine(in_RDI,1);
      if ((bVar4) && (((in_ESI == 0x12 || (in_ESI == 0xb)) || (in_ESI == 0x11)))) {
        act(in_stack_ffffffffffffffd0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
        bVar4 = false;
      }
      else {
        bVar4 = check_entwine(in_RDI,0);
        if ((bVar4) && (in_ESI == 0x10)) {
          act(in_stack_ffffffffffffffd0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0)
          ;
          bVar4 = false;
        }
        else {
          pOVar1 = get_eq_char(in_RDI,0x12);
          unequip_char((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                       (OBJ_DATA *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       SUB81((ulong)in_RDI >> 0x38,0));
          if (in_ESI == 0x12) {
            act(in_stack_ffffffffffffffd0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                0);
            act(in_stack_ffffffffffffffd0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                0);
            bVar4 = true;
          }
          else {
            for (obj_01 = in_RDI->carrying; uVar3 = (undefined1)((ulong)in_RDI >> 0x38),
                obj_01 != (OBJ_DATA *)0x0; obj_01 = obj_01->next_content) {
              bVar4 = is_worn(obj_01);
              if ((bVar4) &&
                 (bVar4 = can_wear((OBJ_DATA *)ch_00,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)
                                  ), bVar4)) {
                in_stack_ffffffffffffffc0 = (void *)obj_01->extra_flags[0];
                _Var2 = std::pow<int,int>(0,0x576470);
                if (((ulong)in_stack_ffffffffffffffc0 & (long)_Var2) != 0) {
                  in_stack_ffffffffffffffb8 = (CHAR_DATA *)(double)obj_01->wear_flags[0];
                  _Var2 = std::pow<int,int>(0,0x5764a5);
                  uVar3 = (undefined1)((ulong)in_RDI >> 0x38);
                  if (((double)in_stack_ffffffffffffffb8 - _Var2 == (double)obj_00->wear_flags[0])
                     && (!NAN((double)in_stack_ffffffffffffffb8 - _Var2) &&
                         !NAN((double)obj_00->wear_flags[0]))) break;
                }
              }
            }
            if (obj_01 == (OBJ_DATA *)0x0) {
              act((char *)0x0,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
              act((char *)obj_01,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
            }
            else {
              act((char *)obj_01,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
              act((char *)obj_01,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
            }
            if ((in_ESI == 0x10) && (pOVar1 != (OBJ_DATA *)0x0)) {
              unequip_char((CHAR_DATA *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                           (OBJ_DATA *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                           ,(bool)uVar3);
              uVar3 = (undefined1)((uint)unaff_retaddr >> 0x18);
              act((char *)obj_01,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
              act((char *)obj_01,ch_00,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
              equip_char(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)uVar3);
            }
            bVar4 = true;
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool remove_obj(CHAR_DATA *ch, int iWear, bool fReplace)
{
	OBJ_DATA *obj, *secondary, *revealed;

	obj = get_eq_char(ch, iWear);

	if (iWear == WEAR_COSMETIC || obj == nullptr)
		return true;

	if (!fReplace)
		return false;

	if (IS_SET(obj->extra_flags, ITEM_NOREMOVE))
	{
		act("You can't remove $p.", ch, obj, nullptr, TO_CHAR);

		if (!is_immortal(ch))
			return false;
	}

	if (is_affected_obj(obj, gsn_rust))
	{
		act("$p is covered with rust and can't be pried off!", ch, obj, 0, TO_CHAR);
		return false;
	}

	if (iWear == WEAR_WIELD && is_affected(ch, gsn_unbreakable))
	{
		act("$p is frozen to your hand!", ch, obj, nullptr, TO_CHAR);

		if (!is_immortal(ch))
			return false;
	}

	if (check_entwine(ch, 1) && (iWear == WEAR_DUAL_WIELD || iWear == WEAR_SHIELD || iWear == WEAR_HOLD))
	{
		act("You can't remove $p.", ch, obj, nullptr, TO_CHAR);
		return false;
	}

	if (check_entwine(ch, 0) && (iWear == WEAR_WIELD))
	{
		act("You can't remove $p.", ch, obj, nullptr, TO_CHAR);
		return false;
	}

	secondary = get_eq_char(ch, WEAR_DUAL_WIELD);

	unequip_char(ch, obj, true);

	if (iWear == WEAR_DUAL_WIELD)
	{
		act("$n stops dual wielding $p.", ch, obj, 0, TO_ROOM);
		act("You stop dual wielding $p.", ch, obj, 0, TO_CHAR);
		return true;
	}

	for (revealed = ch->carrying; revealed; revealed = revealed->next_content)
	{
		if (is_worn(revealed) && can_wear(revealed, ITEM_WEAR_COSMETIC))
		{
			if (IS_SET(revealed->extra_flags, ITEM_UNDER_CLOTHES))
			{
				if (revealed->wear_flags[0] - pow(2, ITEM_WEAR_COSMETIC) == obj->wear_flags[0])
					break;
			}
		}
	}

	if (revealed)
	{
		act("$n removes $p, revealing $P underneath.", ch, obj, revealed, TO_ROOM);
		act("You remove $p, revealing $P underneath.", ch, obj, revealed, TO_CHAR);
	}
	else
	{
		act("$n removes $p.", ch, obj, nullptr, TO_ROOM);
		act("You remove $p.", ch, obj, nullptr, TO_CHAR);
	}

	if (iWear == WEAR_WIELD && secondary != nullptr)
	{
		unequip_char(ch, secondary, false);
		act("You swap $p into your primary hand.", ch, secondary, nullptr, TO_CHAR);
		act("$n swaps $p into $s primary hand.", ch, secondary, nullptr, TO_ROOM);
		equip_char(ch, secondary, WEAR_WIELD, false);
	}

	return true;
}